

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O0

void deserialize_model<_IO_FILE*>(TreesIndexer *model,_IO_FILE **in)

{
  bool bVar1;
  iterator node;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *in_RSI;
  SingleTreeIndex *tree;
  iterator __end1;
  iterator __begin1;
  vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *__range1;
  size_t vec_size;
  reference in_stack_ffffffffffffffc8;
  FILE **in_stack_ffffffffffffffd0;
  __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
  in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  
  if (!interrupt_switch) {
    read_bytes<unsigned_long>
              (in_stack_ffffffffffffffe0,(size_t)in_stack_ffffffffffffffd8._M_current,
               in_stack_ffffffffffffffd0);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::resize
              (in_RSI,in_stack_ffffffffffffffe8);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::shrink_to_fit
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)0x67c85c);
    std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::begin
              ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
               in_stack_ffffffffffffffc8);
    node = std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>::end
                     ((vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_> *)
                      in_stack_ffffffffffffffc8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)node._M_current,
                              (__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                               *)in_stack_ffffffffffffffc8), bVar1) {
      in_stack_ffffffffffffffc8 =
           __gnu_cxx::
           __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
           ::operator*((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                        *)&stack0xffffffffffffffd8);
      deserialize_node<_IO_FILE*>(node._M_current,(_IO_FILE **)in_stack_ffffffffffffffc8);
      __gnu_cxx::
      __normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
      ::operator++((__normal_iterator<SingleTreeIndex_*,_std::vector<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>_>
                    *)&stack0xffffffffffffffd8);
    }
  }
  return;
}

Assistant:

void deserialize_model(TreesIndexer &model, itype &in)
{
    if (interrupt_switch) return;

    size_t vec_size;
    read_bytes<size_t>(&vec_size, (size_t)1, in);
    model.indices.resize(vec_size);
    model.indices.shrink_to_fit();
    for (auto &tree : model.indices)
        deserialize_node(tree, in);
}